

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-make.c
# Opt level: O0

object * make_gold(wchar_t lev,char *coin_type)

{
  uint32_t uVar1;
  object *obj;
  object_kind *k;
  object *new_gold;
  wchar_t value;
  wchar_t spread;
  wchar_t avg;
  char *coin_type_local;
  wchar_t lev_local;
  
  uVar1 = Rand_div(lev + L'\v' + lev + L'\n');
  obj = (object *)mem_zalloc(0x138);
  for (new_gold._4_4_ = ((lev << 4) / 10 + 0x10 + uVar1) - (lev + L'\n'); uVar1 = Rand_div(100),
      uVar1 == 0 && new_gold._4_4_ * 10 < 0x8000; new_gold._4_4_ = new_gold._4_4_ * 10) {
  }
  k = money_kind(coin_type,new_gold._4_4_);
  object_prep(obj,k,lev,RANDOMISE);
  if ((((player->opts).opt[0x26] & 1U) != 0) && (player->depth != 0)) {
    new_gold._4_4_ = new_gold._4_4_ * 5;
  }
  if (L'翾' < new_gold._4_4_) {
    uVar1 = Rand_div(200);
    new_gold._4_4_ = L'翿' - uVar1;
  }
  obj->pval = (int16_t)new_gold._4_4_;
  return obj;
}

Assistant:

struct object *make_gold(int lev, const char *coin_type)
{
	/* This average is 16 at dlev0, 80 at dlev40, 176 at dlev100. */
	int avg = (16 * lev)/10 + 16;
	int spread = lev + 10;
	int value = rand_spread(avg, spread);
	struct object *new_gold = mem_zalloc(sizeof(*new_gold)); 

	/* Increase the range to infinite, moving the average to 110% */
	while (one_in_(100) && value * 10 <= SHRT_MAX)
		value *= 10;

	/* Prepare a gold object */
	object_prep(new_gold, money_kind(coin_type, value), lev, RANDOMISE);

	/* If we're playing with no_selling, increase the value */
	if (OPT(player, birth_no_selling) && player->depth)	{
		value *= 5;
	}

	/* Cap gold at max short (or alternatively make pvals int32_t) */
	if (value >= SHRT_MAX) {
		value = SHRT_MAX - randint0(200);
	}

	new_gold->pval = value;

	return new_gold;
}